

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O0

void __thiscall
FastPForLib::FastBinaryPacking<32U>::encodeArray
          (FastBinaryPacking<32U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint32_t uVar1;
  ulong uVar2;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_R8;
  uint32_t i_1;
  uint32_t i;
  uint32_t *final;
  uint32_t Bs [4];
  uint32_t *initout;
  uint bit;
  uint **in_stack_ffffffffffffff98;
  uint **in_stack_ffffffffffffffa0;
  uint local_54;
  uint32_t local_48 [3];
  uint local_3c;
  undefined4 *local_30;
  long *local_28;
  uint *local_20;
  long local_18;
  long local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  checkifdivisibleby(Bs._0_8_,final._4_4_);
  local_30 = local_20;
  *local_20 = (int)local_18;
  uVar2 = local_10 + local_18 * 4;
  local_20 = local_20 + 1;
  for (; local_10 + 0x200U <= uVar2; local_10 = local_10 + 0x200) {
    for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
      in_stack_ffffffffffffffa0 = (uint **)(local_10 + (ulong)(local_54 << 5) * 4);
      in_stack_ffffffffffffff98 = (uint **)(local_10 + (ulong)((local_54 + 1) * 0x20) * 4);
      uVar1 = maxbits<unsigned_int_const*>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_48[local_54] = uVar1;
    }
    *local_20 = local_48[0] << 0x18 | local_48[1] << 0x10 | local_48[2] << 8 | local_3c;
    local_20 = local_20 + 1;
    for (bit = 0; bit < 4; bit = bit + 1) {
      fastpackwithoutmask((uint32_t *)in_stack_ffffffffffffffa0,
                          (uint32_t *)in_stack_ffffffffffffff98,bit);
      local_20 = local_20 + local_48[bit];
    }
  }
  *local_28 = (long)local_20 - (long)local_30 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    for (const uint32_t *const final = in + length; in + BlockSize <= final;
         in += BlockSize) {
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          out = fastpackwithoutmask_8(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 16)
          out = fastpackwithoutmask_16(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 24)
          out = fastpackwithoutmask_24(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastpackwithoutmask(in + i * MiniBlockSize, out, Bs[i]);
          out += Bs[i];

        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
  }